

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int io_readline(lua_State *L)

{
  FILE *__stream;
  int iVar1;
  int iVar2;
  undefined8 *puVar3;
  int *piVar4;
  char *pcVar5;
  
  puVar3 = (undefined8 *)lua_touserdata(L,-0x2713);
  __stream = (FILE *)*puVar3;
  if (__stream == (FILE *)0x0) {
    luaL_error(L,"file is already closed");
  }
  iVar1 = read_line(L,(FILE *)__stream);
  iVar2 = ferror(__stream);
  if (iVar2 == 0) {
    if (iVar1 == 0) {
      iVar2 = lua_toboolean(L,-0x2714);
      iVar1 = 0;
      if (iVar2 != 0) {
        lua_settop(L,0);
        lua_pushvalue(L,-0x2713);
        aux_close(L);
        iVar1 = 0;
      }
    }
    else {
      iVar1 = 1;
    }
    return iVar1;
  }
  piVar4 = __errno_location();
  pcVar5 = strerror(*piVar4);
  luaL_error(L,"%s",pcVar5);
}

Assistant:

static int io_readline(lua_State*L){
FILE*f=*(FILE**)lua_touserdata(L,lua_upvalueindex(1));
int sucess;
if(f==NULL)
luaL_error(L,"file is already closed");
sucess=read_line(L,f);
if(ferror(f))
return luaL_error(L,"%s",strerror(errno));
if(sucess)return 1;
else{
if(lua_toboolean(L,lua_upvalueindex(2))){
lua_settop(L,0);
lua_pushvalue(L,lua_upvalueindex(1));
aux_close(L);
}
return 0;
}
}